

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

void __thiscall Map::calcEntity(Map *this,int n)

{
  Entity *pEVar1;
  Palette *pPVar2;
  float fVar3;
  
  pEVar1 = this->entity[n];
  if (pEVar1 != (Entity *)0x0) {
    fVar3 = pEVar1->y + 0.3;
    pEVar1->y = fVar3;
    if (((float)this->fieldBreakpoint <= fVar3) &&
       (pPVar2 = this->palette, fVar3 <= (float)(this->fieldBreakpoint + pPVar2->h))) {
      fVar3 = pEVar1->x + -16.0;
      if (((float)pPVar2->pos <= fVar3) && (fVar3 <= (float)(pPVar2->pos + pPVar2->w))) {
        parseAward(this,n);
        removeEntity(this,n);
        return;
      }
    }
  }
  return;
}

Assistant:

void Map::calcEntity(int n){
    if(entity[n]){
        entity[n]->y += AWARD_SPEED;
        if(entity[n]->y >= fieldBreakpoint && entity[n]->y <= fieldBreakpoint + palette->h
                && entity[n]->x - ICON_W >= palette->pos && entity[n]->x - ICON_W <= palette->pos + palette->w){
            parseAward(n);
            removeEntity(n);
        }
    }
}